

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_compareCString_firstLessThanSecond_fn(int _i)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_f0;
  char *pcStack_e8;
  char *pcStack_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  AString string2;
  AString string3;
  AString string1;
  
  string1.reallocator._0_4_ = 0x11e238;
  string1.reallocator._4_4_ = 0;
  string1.deallocator._0_4_ = 0x11e278;
  string1.deallocator._4_4_ = 0;
  string1.buffer = (char *)0x0;
  string1.size = 0;
  string1.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14b2c3;
  string1.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *string1.buffer = '\0';
  string2.buffer = (char *)0x0;
  string2.reallocator._0_4_ = 0x11e238;
  string2.reallocator._4_4_ = 0;
  string2.deallocator._0_4_ = 0x11e278;
  string2.deallocator._4_4_ = 0;
  string2.size = 1;
  string2.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14b31c;
  string2.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string2.buffer[0] = 'a';
  string2.buffer[1] = '\0';
  string3.buffer = (char *)0x0;
  string3.reallocator._0_4_ = 0x11e238;
  string3.reallocator._4_4_ = 0;
  string3.deallocator._0_4_ = 0x11e278;
  string3.deallocator._4_4_ = 0;
  string3.size = 1;
  string3.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14b374;
  string3.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string3.buffer[0] = 'b';
  string3.buffer[1] = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_c0 = 0x14b3ac;
  uVar1 = AString_compareCString(&string1,"a");
  if (-1 < (int)uVar1) {
    local_d8 = (char *)(ulong)uVar1;
    ppcVar7 = &local_d8;
    local_d0 = "0";
    pcVar5 = "Assertion \'_ck_x < _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar8 = "AString_compareCString(&string1, \"a\") < 0";
    pcVar9 = "AString_compareCString(&string1, \"a\")";
    iVar2 = 0x925;
    goto LAB_0014bda9;
  }
  uStack_c0 = 0x14b3c5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x925);
  if (string1.capacity != 8) {
    pcVar8 = "(string1).capacity == (8)";
    pcVar4 = "(string1).capacity";
    iVar2 = 0x926;
    pcVar5 = (char *)string1.capacity;
LAB_0014bc86:
    local_d0 = "(8)";
    local_c8 = (char *)0x8;
LAB_0014bd5c:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_d0;
    goto LAB_0014bd5e;
  }
  uStack_c0 = 0x14b3e5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (string1.buffer == (char *)0x0) {
    ppcVar7 = &local_c8;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string1).buffer != NULL";
    pcVar9 = "(void*) (string1).buffer";
LAB_0014b893:
    iVar2 = 0x926;
LAB_0014bda9:
    uStack_c0 = 0;
    local_c8 = (char *)0x0;
    *(code **)((long)ppcVar7 + -8) = test_AString_compareCString_firstGreaterThanSecond_fn;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
  }
  uStack_c0 = 0x14b405;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (string1.buffer == (char *)0x0) {
    pcStack_f0 = "(null)";
    pcStack_e8 = "";
LAB_0014b809:
    uStack_c0 = 0;
    local_c8 = "\"";
    local_d0 = "";
    local_d8 = "\"";
    pcStack_e0 = "(\"\")";
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x926,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(string1).buffer == (\"\")","(string1).buffer",pcStack_e8);
  }
  if (*string1.buffer != '\0') {
    pcStack_e8 = "\"";
    pcStack_f0 = string1.buffer;
    goto LAB_0014b809;
  }
  uStack_c0 = 0x14b438;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (string1.size != 0) {
    ppcVar7 = &local_d8;
    local_d0 = "strlen(\"\")";
    local_d8 = (char *)string1.size;
    pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar8 = "(string1).size == strlen(\"\")";
    pcVar9 = "(string1).size";
    goto LAB_0014b893;
  }
  uStack_c0 = 0x14b457;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x926);
  if (private_ACUtilsTest_AString_reallocCount != 0) {
    ppcVar7 = &local_d8;
    local_d0 = "(0)";
    local_d8 = (char *)private_ACUtilsTest_AString_reallocCount;
    pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
    pcVar9 = "private_ACUtilsTest_AString_reallocCount";
    iVar2 = 0x927;
    goto LAB_0014bda9;
  }
  uStack_c0 = 0x14b478;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x927);
  uStack_c0 = 0x14b48a;
  uVar1 = AString_compareCString(&string2,"b");
  if (-1 < (int)uVar1) {
    local_d8 = (char *)(ulong)uVar1;
    ppcVar7 = &local_d8;
    local_d0 = "0";
    pcVar5 = "Assertion \'_ck_x < _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar8 = "AString_compareCString(&string2, \"b\") < 0";
    pcVar9 = "AString_compareCString(&string2, \"b\")";
    iVar2 = 0x928;
    goto LAB_0014bda9;
  }
  uStack_c0 = 0x14b4a3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x928);
  if (string2.capacity != 8) {
    pcVar8 = "(string2).capacity == (8)";
    pcVar4 = "(string2).capacity";
    iVar2 = 0x929;
    pcVar5 = (char *)string2.capacity;
    goto LAB_0014bc86;
  }
  uStack_c0 = 0x14b4c3;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x929);
  if (string2.buffer == (char *)0x0) {
    ppcVar7 = &local_c8;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string2).buffer != NULL";
    pcVar9 = "(void*) (string2).buffer";
    iVar2 = 0x929;
    goto LAB_0014bda9;
  }
  uStack_c0 = 0x14b4e0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x929);
  pcVar9 = string2.buffer;
  if (string2.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
  }
  else {
    uStack_c0 = 0x14b500;
    iVar2 = strcmp("a",string2.buffer);
    if (iVar2 == 0) {
      uStack_c0 = 0x14b519;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x929);
      if (string2.size != 1) {
        local_d0 = "strlen(\"a\")";
        pcVar8 = "(string2).size == strlen(\"a\")";
        pcVar4 = "(string2).size";
        iVar2 = 0x929;
        pcVar5 = (char *)string2.size;
        goto LAB_0014bd56;
      }
      uStack_c0 = 0x14b539;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x929);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar7 = &local_d8;
        local_d0 = "(0)";
        local_d8 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar9 = "private_ACUtilsTest_AString_reallocCount";
        iVar2 = 0x92a;
        goto LAB_0014bda9;
      }
      uStack_c0 = 0x14b55a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x92a);
      uStack_c0 = 0x14b569;
      uVar1 = AString_compareCString(&string2,"ba");
      if (-1 < (int)uVar1) {
        local_d8 = (char *)(ulong)uVar1;
        ppcVar7 = &local_d8;
        local_d0 = "0";
        pcVar5 = "Assertion \'_ck_x < _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar8 = "AString_compareCString(&string2, \"ba\") < 0";
        pcVar9 = "AString_compareCString(&string2, \"ba\")";
        iVar2 = 0x92b;
        goto LAB_0014bda9;
      }
      uStack_c0 = 0x14b582;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x92b);
      if (string2.capacity != 8) {
        pcVar8 = "(string2).capacity == (8)";
        pcVar4 = "(string2).capacity";
        iVar2 = 0x92c;
        pcVar5 = (char *)string2.capacity;
        goto LAB_0014bc86;
      }
      uStack_c0 = 0x14b5a2;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x92c);
      if (string2.buffer == (char *)0x0) {
        ppcVar7 = &local_c8;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %#x";
        pcVar8 = "(void*) (string2).buffer != NULL";
        pcVar9 = "(void*) (string2).buffer";
        iVar2 = 0x92c;
        goto LAB_0014bda9;
      }
      uStack_c0 = 0x14b5bf;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x92c);
      pcVar9 = string2.buffer;
      if (string2.buffer == (char *)0x0) {
        pcVar5 = "";
        pcVar9 = "(null)";
LAB_0014bb49:
        pcVar8 = "(string2).buffer == (\"a\")";
        pcVar4 = "(void*) (string2).buffer";
        iVar2 = 0x92c;
        local_d0 = "a";
        pcStack_e0 = "(string1).buffer == (\"a\")";
      }
      else {
        uStack_c0 = 0x14b5dc;
        iVar2 = strcmp("a",string2.buffer);
        if (iVar2 != 0) {
          pcVar5 = "\"";
          goto LAB_0014bb49;
        }
        uStack_c0 = 0x14b5f5;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92c);
        if (string2.size != 1) {
          local_d0 = "strlen(\"a\")";
          pcVar8 = "(string2).size == strlen(\"a\")";
          pcVar4 = "(string2).size";
          iVar2 = 0x92c;
          pcVar5 = (char *)string2.size;
LAB_0014bd56:
          local_c8 = (char *)0x1;
          goto LAB_0014bd5c;
        }
        uStack_c0 = 0x14b615;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92c);
        if (private_ACUtilsTest_AString_reallocCount != 0) {
          ppcVar7 = &local_d8;
          local_d0 = "(0)";
          local_d8 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x92d;
          goto LAB_0014bda9;
        }
        uStack_c0 = 0x14b636;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92d);
        uStack_c0 = 0x14b647;
        uVar1 = AString_compareCString(&string3,"ba");
        if (-1 < (int)uVar1) {
          local_d8 = (char *)(ulong)uVar1;
          ppcVar7 = &local_d8;
          local_d0 = "0";
          pcVar5 = "Assertion \'_ck_x < _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar8 = "AString_compareCString(&string3, \"ba\") < 0";
          pcVar9 = "AString_compareCString(&string3, \"ba\")";
          iVar2 = 0x92e;
          goto LAB_0014bda9;
        }
        uStack_c0 = 0x14b660;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92e);
        if (string3.capacity != 8) {
          pcVar8 = "(string3).capacity == (8)";
          pcVar4 = "(string3).capacity";
          iVar2 = 0x92f;
          pcVar5 = (char *)string3.capacity;
          goto LAB_0014bc86;
        }
        uStack_c0 = 0x14b680;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92f);
        if (string3.buffer == (char *)0x0) {
          ppcVar7 = &local_c8;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) (string3).buffer != NULL";
          pcVar9 = "(void*) (string3).buffer";
          iVar2 = 0x92f;
          goto LAB_0014bda9;
        }
        uStack_c0 = 0x14b69d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x92f);
        pcVar9 = string3.buffer;
        if (string3.buffer == (char *)0x0) {
          pcVar9 = "(null)";
          pcVar5 = "";
        }
        else {
          uStack_c0 = 0x14b6ba;
          iVar2 = strcmp("b",string3.buffer);
          if (iVar2 == 0) {
            uStack_c0 = 0x14b6d3;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x92f);
            if (string3.size == 1) {
              uStack_c0 = 0x14b6f3;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x92f);
              if (private_ACUtilsTest_AString_reallocCount == 0) {
                uStack_c0 = 0x14b714;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x930);
                uStack_c0 = 0x14b720;
                (*(code *)CONCAT44(string1.deallocator._4_4_,string1.deallocator._0_4_))
                          (string1.buffer);
                uStack_c0 = 0x14b729;
                (*(code *)CONCAT44(string2.deallocator._4_4_,string2.deallocator._0_4_))
                          (string2.buffer);
                uStack_c0 = 0x14b732;
                (*(code *)CONCAT44(string3.deallocator._4_4_,string3.deallocator._0_4_))
                          (string3.buffer);
                return;
              }
              ppcVar7 = &local_d8;
              local_d0 = "(0)";
              local_d8 = (char *)private_ACUtilsTest_AString_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
              pcVar9 = "private_ACUtilsTest_AString_reallocCount";
              iVar2 = 0x930;
              goto LAB_0014bda9;
            }
            local_d0 = "strlen(\"b\")";
            pcVar8 = "(string3).size == strlen(\"b\")";
            pcVar4 = "(string3).size";
            iVar2 = 0x92f;
            pcVar5 = (char *)string3.size;
            goto LAB_0014bd56;
          }
          pcVar5 = "\"";
        }
        pcVar8 = "(string3).buffer == (\"b\")";
        pcVar4 = "(void*) (string3).buffer";
        iVar2 = 0x92f;
        local_d0 = "b";
        pcStack_e0 = "(string2).buffer == (\"b\")";
      }
      pcStack_e0 = pcStack_e0 + 0x14;
      pcVar4 = pcVar4 + 8;
      local_c8 = "\"";
      local_d8 = "\"";
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      ppcVar6 = &pcStack_f0;
      pcStack_f0 = pcVar9;
      pcStack_e8 = pcVar5;
      goto LAB_0014bd5e;
    }
    pcVar5 = "\"";
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  pcVar8 = "(string2).buffer == (\"a\")";
  pcVar4 = "(string2).buffer";
  iVar2 = 0x929;
  local_c8 = "\"";
  local_d0 = "a";
  local_d8 = "\"";
  pcStack_e0 = "(\"a\")";
  ppcVar6 = &pcStack_f0;
  pcStack_f0 = pcVar9;
  pcStack_e8 = pcVar5;
LAB_0014bd5e:
  uStack_c0 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x14bd65;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_AString_compareCString_firstLessThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string1, "a"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "b"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string3, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
}